

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tenor.cpp
# Opt level: O0

void bidfx_public_api::Tenor::CreateTenorList(void)

{
  mapped_type *ppTVar1;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_28;
  
  ToString_abi_cxx11_(&local_28,(Tenor *)BROKEN_DATE);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_28);
  *ppTVar1 = (mapped_type)BROKEN_DATE;
  std::__cxx11::string::~string((string *)&local_28);
  ToString_abi_cxx11_(&local_58,(Tenor *)TODAY);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_58);
  *ppTVar1 = (mapped_type)TODAY;
  std::__cxx11::string::~string((string *)&local_58);
  ToString_abi_cxx11_(&local_78,(Tenor *)TOMORROW);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_78);
  *ppTVar1 = (mapped_type)TOMORROW;
  std::__cxx11::string::~string((string *)&local_78);
  ToString_abi_cxx11_(&local_98,(Tenor *)SPOT);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_98);
  *ppTVar1 = (mapped_type)SPOT;
  std::__cxx11::string::~string((string *)&local_98);
  ToString_abi_cxx11_(&local_b8,(Tenor *)SPOT_NEXT);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_b8);
  *ppTVar1 = (mapped_type)SPOT_NEXT;
  std::__cxx11::string::~string((string *)&local_b8);
  ToString_abi_cxx11_(&local_d8,(Tenor *)IN_1_WEEK);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_d8);
  *ppTVar1 = (mapped_type)IN_1_WEEK;
  std::__cxx11::string::~string((string *)&local_d8);
  ToString_abi_cxx11_(&local_f8,(Tenor *)IN_2_WEEKS);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_f8);
  *ppTVar1 = (mapped_type)IN_2_WEEKS;
  std::__cxx11::string::~string((string *)&local_f8);
  ToString_abi_cxx11_(&local_118,(Tenor *)IN_3_WEEKS);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_118);
  *ppTVar1 = (mapped_type)IN_3_WEEKS;
  std::__cxx11::string::~string((string *)&local_118);
  ToString_abi_cxx11_(&local_138,(Tenor *)IN_1_MONTH);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_138);
  *ppTVar1 = (mapped_type)IN_1_MONTH;
  std::__cxx11::string::~string((string *)&local_138);
  ToString_abi_cxx11_(&local_158,(Tenor *)IN_2_MONTHS);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_158);
  *ppTVar1 = (mapped_type)IN_2_MONTHS;
  std::__cxx11::string::~string((string *)&local_158);
  ToString_abi_cxx11_(&local_178,(Tenor *)IN_3_MONTHS);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_178);
  *ppTVar1 = (mapped_type)IN_3_MONTHS;
  std::__cxx11::string::~string((string *)&local_178);
  ToString_abi_cxx11_(&local_198,(Tenor *)IN_4_MONTHS);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_198);
  *ppTVar1 = (mapped_type)IN_4_MONTHS;
  std::__cxx11::string::~string((string *)&local_198);
  ToString_abi_cxx11_(&local_1b8,(Tenor *)IN_5_MONTHS);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_1b8);
  *ppTVar1 = (mapped_type)IN_5_MONTHS;
  std::__cxx11::string::~string((string *)&local_1b8);
  ToString_abi_cxx11_(&local_1d8,(Tenor *)IN_6_MONTHS);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_1d8);
  *ppTVar1 = (mapped_type)IN_6_MONTHS;
  std::__cxx11::string::~string((string *)&local_1d8);
  ToString_abi_cxx11_(&local_1f8,(Tenor *)IN_7_MONTHS);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_1f8);
  *ppTVar1 = (mapped_type)IN_7_MONTHS;
  std::__cxx11::string::~string((string *)&local_1f8);
  ToString_abi_cxx11_(&local_218,(Tenor *)IN_8_MONTHS);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_218);
  *ppTVar1 = (mapped_type)IN_8_MONTHS;
  std::__cxx11::string::~string((string *)&local_218);
  ToString_abi_cxx11_(&local_238,(Tenor *)IN_9_MONTHS);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_238);
  *ppTVar1 = (mapped_type)IN_9_MONTHS;
  std::__cxx11::string::~string((string *)&local_238);
  ToString_abi_cxx11_(&local_258,(Tenor *)IN_10_MONTHS);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_258);
  *ppTVar1 = (mapped_type)IN_10_MONTHS;
  std::__cxx11::string::~string((string *)&local_258);
  ToString_abi_cxx11_(&local_278,(Tenor *)IN_11_MONTHS);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_278);
  *ppTVar1 = (mapped_type)IN_11_MONTHS;
  std::__cxx11::string::~string((string *)&local_278);
  ToString_abi_cxx11_(&local_298,(Tenor *)IN_1_YEAR);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_298);
  *ppTVar1 = (mapped_type)IN_1_YEAR;
  std::__cxx11::string::~string((string *)&local_298);
  ToString_abi_cxx11_(&local_2b8,(Tenor *)IN_2_YEARS);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_2b8);
  *ppTVar1 = (mapped_type)IN_2_YEARS;
  std::__cxx11::string::~string((string *)&local_2b8);
  ToString_abi_cxx11_(&local_2d8,(Tenor *)IN_3_YEARS);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_2d8);
  *ppTVar1 = (mapped_type)IN_3_YEARS;
  std::__cxx11::string::~string((string *)&local_2d8);
  ToString_abi_cxx11_(&local_2f8,(Tenor *)IMM_MARCH);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_2f8);
  *ppTVar1 = (mapped_type)IMM_MARCH;
  std::__cxx11::string::~string((string *)&local_2f8);
  ToString_abi_cxx11_(&local_318,(Tenor *)IMM_JUNE);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_318);
  *ppTVar1 = (mapped_type)IMM_JUNE;
  std::__cxx11::string::~string((string *)&local_318);
  ToString_abi_cxx11_(&local_338,(Tenor *)IMM_SEPTEMBER);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_338);
  *ppTVar1 = (mapped_type)IMM_SEPTEMBER;
  std::__cxx11::string::~string((string *)&local_338);
  ToString_abi_cxx11_(&local_358,(Tenor *)IMM_DECEMBER);
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_bidfx_public_api::Tenor_*>_>_>
                          *)tenor_list__abi_cxx11_,&local_358);
  *ppTVar1 = (mapped_type)IMM_DECEMBER;
  std::__cxx11::string::~string((string *)&local_358);
  return;
}

Assistant:

void Tenor::CreateTenorList()
{
    tenor_list_[Tenor::BROKEN_DATE.ToString()] = &Tenor::BROKEN_DATE;
    tenor_list_[Tenor::TODAY.ToString()] = &Tenor::TODAY;
    tenor_list_[Tenor::TOMORROW.ToString()] = &Tenor::TOMORROW;
    tenor_list_[Tenor::SPOT.ToString()] = &Tenor::SPOT;
    tenor_list_[Tenor::SPOT_NEXT.ToString()] = &Tenor::SPOT_NEXT;
    tenor_list_[Tenor::IN_1_WEEK.ToString()] = &Tenor::IN_1_WEEK;
    tenor_list_[Tenor::IN_2_WEEKS.ToString()] = &Tenor::IN_2_WEEKS;
    tenor_list_[Tenor::IN_3_WEEKS.ToString()] = &Tenor::IN_3_WEEKS;
    tenor_list_[Tenor::IN_1_MONTH.ToString()] = &Tenor::IN_1_MONTH;
    tenor_list_[Tenor::IN_2_MONTHS.ToString()] = &Tenor::IN_2_MONTHS;
    tenor_list_[Tenor::IN_3_MONTHS.ToString()] = &Tenor::IN_3_MONTHS;
    tenor_list_[Tenor::IN_4_MONTHS.ToString()] = &Tenor::IN_4_MONTHS;
    tenor_list_[Tenor::IN_5_MONTHS.ToString()] = &Tenor::IN_5_MONTHS;
    tenor_list_[Tenor::IN_6_MONTHS.ToString()] = &Tenor::IN_6_MONTHS;
    tenor_list_[Tenor::IN_7_MONTHS.ToString()] = &Tenor::IN_7_MONTHS;
    tenor_list_[Tenor::IN_8_MONTHS.ToString()] = &Tenor::IN_8_MONTHS;
    tenor_list_[Tenor::IN_9_MONTHS.ToString()] = &Tenor::IN_9_MONTHS;
    tenor_list_[Tenor::IN_10_MONTHS.ToString()] = &Tenor::IN_10_MONTHS;
    tenor_list_[Tenor::IN_11_MONTHS.ToString()] = &Tenor::IN_11_MONTHS;
    tenor_list_[Tenor::IN_1_YEAR.ToString()] = &Tenor::IN_1_YEAR;
    tenor_list_[Tenor::IN_2_YEARS.ToString()] = &Tenor::IN_2_YEARS;
    tenor_list_[Tenor::IN_3_YEARS.ToString()] = &Tenor::IN_3_YEARS;
    tenor_list_[Tenor::IMM_MARCH.ToString()] = &Tenor::IMM_MARCH;
    tenor_list_[Tenor::IMM_JUNE.ToString()] = &Tenor::IMM_JUNE;
    tenor_list_[Tenor::IMM_SEPTEMBER.ToString()] = &Tenor::IMM_SEPTEMBER;
    tenor_list_[Tenor::IMM_DECEMBER.ToString()] = &Tenor::IMM_DECEMBER;
}